

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hpp
# Opt level: O2

ostream * pg::operator<<(ostream *out,_label_vertex *lv)

{
  string *psVar1;
  ostream *poVar2;
  long lVar3;
  
  lVar3 = (long)lv->v;
  if ((lVar3 < 0) || (lv->g->n_vertices <= lVar3)) {
    std::operator<<(out,"<N/A>");
  }
  else {
    psVar1 = lv->g->_label[lVar3];
    if ((psVar1 == (string *)0x0) || (psVar1->_M_string_length == 0)) {
      poVar2 = (ostream *)std::ostream::operator<<(out,lv->v);
      poVar2 = std::operator<<(poVar2,"/");
      std::ostream::operator<<(poVar2,lv->g->_priority[lv->v]);
    }
    else {
      std::operator<<(out,(string *)psVar1);
    }
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const _label_vertex &lv) {
            if (lv.v < 0 or lv.v >= lv.g.nodecount()) {
                out << "<N/A>";
            } else {
                std::string* l = lv.g.rawlabel(lv.v);
                if (l == nullptr or l->empty()) out << lv.v << "/" << lv.g.priority(lv.v);
                else out << *l;
            }
            return out;
        }